

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::
InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
::operator()(InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
             *this,InTuple<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                   *in1,
            InTuple<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *in2)

{
  float fVar1;
  bool bVar2;
  
  fVar1 = (in1->super_Tuple4<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>).a;
  bVar2 = true;
  if ((((in2->super_Tuple4<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>).a <=
        fVar1) &&
      (bVar2 = false,
      fVar1 <= (in2->
               super_Tuple4<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>).a))
     && (bVar2 = true,
        (in2->super_Tuple4<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>).b <=
        (in1->super_Tuple4<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>).b))
  {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator() (const float& val1, const float& val2) const
	{
		if (deIsNaN(val1))
			return false;
		if (deIsNaN(val2))
			return true;
		return val1 < val2;
	}